

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error processXmlDecl(XML_Parser parser,int isGeneralTextEntity,char *s,char *next)

{
  ENCODING *pEVar1;
  char *pcVar2;
  int iVar3;
  XML_Error XVar4;
  code *pcVar5;
  XML_Char *encodingName_00;
  XML_Char *pXVar6;
  bool bVar7;
  int standalone;
  char *encodingName;
  undefined8 *local_50;
  char *version;
  ENCODING *newEncoding;
  char *versionend;
  
  encodingName = (char *)0x0;
  newEncoding = (ENCODING *)0x0;
  version = (char *)0x0;
  standalone = -1;
  if (*(int *)((long)parser + 0x1c8) == 0) {
    pcVar5 = cm_expat_XmlParseXmlDecl;
  }
  else {
    pcVar5 = cm_expat_XmlParseXmlDeclNS;
  }
  local_50 = (undefined8 *)((long)parser + 0x218);
  iVar3 = (*pcVar5)(isGeneralTextEntity,*(undefined8 *)((long)parser + 0x118),s,next,local_50,
                    &version,&versionend,&encodingName,&newEncoding,&standalone);
  pcVar2 = encodingName;
  if (iVar3 == 0) {
    return XML_ERROR_SYNTAX;
  }
  if (((isGeneralTextEntity == 0) && (standalone == 1)) &&
     (*(undefined4 *)((long)parser + 0x364) = 1, *(int *)((long)parser + 0x48c) == 1)) {
    *(undefined4 *)((long)parser + 0x48c) = 0;
  }
  if (*(long *)((long)parser + 0x110) == 0) {
    if (*(long *)((long)parser + 0xa0) != 0) {
      reportDefault(parser,*(ENCODING **)((long)parser + 0x118),s,next);
    }
    encodingName_00 = (XML_Char *)0x0;
    bVar7 = false;
  }
  else {
    if (encodingName == (char *)0x0) {
      encodingName_00 = (XML_Char *)0x0;
    }
    else {
      pEVar1 = *(ENCODING **)((long)parser + 0x118);
      iVar3 = (*pEVar1->nameLength)(pEVar1,encodingName);
      encodingName_00 =
           poolStoreString((STRING_POOL *)((long)parser + 0x448),pEVar1,pcVar2,pcVar2 + iVar3);
      if (encodingName_00 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      *(undefined8 *)((long)parser + 0x468) = *(undefined8 *)((long)parser + 0x460);
    }
    if (version == (char *)0x0) {
      pXVar6 = (XML_Char *)0x0;
    }
    else {
      pXVar6 = poolStoreString((STRING_POOL *)((long)parser + 0x448),
                               *(ENCODING **)((long)parser + 0x118),version,
                               versionend +
                               -(long)(*(ENCODING **)((long)parser + 0x118))->minBytesPerChar);
      if (pXVar6 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
    }
    (**(code **)((long)parser + 0x110))
              (*(undefined8 *)((long)parser + 8),pXVar6,encodingName_00,standalone);
    bVar7 = pXVar6 != (XML_Char *)0x0;
  }
  pcVar2 = encodingName;
  if (*(long *)((long)parser + 0x1c0) == 0) {
    if (newEncoding == (ENCODING *)0x0) {
      if (encodingName != (char *)0x0) {
        if (encodingName_00 == (XML_Char *)0x0) {
          pEVar1 = *(ENCODING **)((long)parser + 0x118);
          iVar3 = (*pEVar1->nameLength)(pEVar1,encodingName);
          encodingName_00 =
               poolStoreString((STRING_POOL *)((long)parser + 0x448),pEVar1,pcVar2,pcVar2 + iVar3);
          if (encodingName_00 == (XML_Char *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
        }
        XVar4 = handleUnknownEncoding(parser,encodingName_00);
        poolClear((STRING_POOL *)((long)parser + 0x418));
        if (XVar4 != XML_ERROR_UNKNOWN_ENCODING) {
          return XVar4;
        }
        *local_50 = encodingName;
        return XML_ERROR_UNKNOWN_ENCODING;
      }
    }
    else {
      if (newEncoding->minBytesPerChar != *(int *)(*(long *)((long)parser + 0x118) + 0x88)) {
        *local_50 = encodingName;
        return XML_ERROR_INCORRECT_ENCODING;
      }
      *(ENCODING **)((long)parser + 0x118) = newEncoding;
    }
  }
  if (!(bool)(encodingName_00 == (XML_Char *)0x0 & (bVar7 ^ 1U))) {
    poolClear((STRING_POOL *)((long)parser + 0x448));
  }
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error
processXmlDecl(XML_Parser parser, int isGeneralTextEntity,
               const char *s, const char *next)
{
  const char *encodingName = 0;
  const char *storedEncName = 0;
  const ENCODING *newEncoding = 0;
  const char *version = 0;
  const char *versionend;
  const char *storedversion = 0;
  int standalone = -1;
  if (!(ns
        ? XmlParseXmlDeclNS
        : XmlParseXmlDecl)(isGeneralTextEntity,
                           encoding,
                           s,
                           next,
                           &eventPtr,
                           &version,
                           &versionend,
                           &encodingName,
                           &newEncoding,
                           &standalone))
    return XML_ERROR_SYNTAX;
  if (!isGeneralTextEntity && standalone == 1) {
    dtd.standalone = 1;
#ifdef XML_DTD
    if (paramEntityParsing == XML_PARAM_ENTITY_PARSING_UNLESS_STANDALONE)
      paramEntityParsing = XML_PARAM_ENTITY_PARSING_NEVER;
#endif /* XML_DTD */
  }
  if (xmlDeclHandler) {
    if (encodingName) {
      storedEncName = poolStoreString(&temp2Pool,
                                      encoding,
                                      encodingName,
                                      encodingName
                                      + XmlNameLength(encoding, encodingName));
      if (! storedEncName)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&temp2Pool);
    }
    if (version) {
      storedversion = poolStoreString(&temp2Pool,
                                      encoding,
                                      version,
                                      versionend - encoding->minBytesPerChar);
      if (! storedversion)
        return XML_ERROR_NO_MEMORY;
    }
    xmlDeclHandler(handlerArg, storedversion, storedEncName, standalone);
  }
  else if (defaultHandler)
    reportDefault(parser, encoding, s, next);
  if (!protocolEncodingName) {
    if (newEncoding) {
      if (newEncoding->minBytesPerChar != encoding->minBytesPerChar) {
        eventPtr = encodingName;
        return XML_ERROR_INCORRECT_ENCODING;
      }
      encoding = newEncoding;
    }
    else if (encodingName) {
      enum XML_Error result;
      if (! storedEncName) {
        storedEncName = poolStoreString(&temp2Pool,
                                        encoding,
                                        encodingName,
                                        encodingName
                                        + XmlNameLength(encoding, encodingName));
        if (! storedEncName)
          return XML_ERROR_NO_MEMORY;
      }
      result = handleUnknownEncoding(parser, storedEncName);
      poolClear(&tempPool);
      if (result == XML_ERROR_UNKNOWN_ENCODING)
        eventPtr = encodingName;
      return result;
    }
  }

  if (storedEncName || storedversion)
    poolClear(&temp2Pool);

  return XML_ERROR_NONE;
}